

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  IResultCapture *pIVar1;
  TestCaseInfo *pTVar2;
  IStreamingReporter *pIVar3;
  TestRunStats local_570;
  string local_510;
  string local_4f0;
  string local_4d0;
  TestCaseStats local_4b0;
  undefined1 local_338 [8];
  Totals deltaTotals;
  TestCaseInfo testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionResult result;
  undefined1 local_68 [8];
  AssertionResultData tempResult;
  string *message_local;
  RunContext *this_local;
  
  tempResult._72_8_ = message;
  AssertionResultData::AssertionResultData((AssertionResultData *)local_68);
  tempResult.message.field_2._8_4_ = 0x210;
  std::__cxx11::string::operator=
            ((string *)(tempResult.reconstructedExpression.field_2._M_local_buf + 8),
             (string *)tempResult._72_8_);
  AssertionResult::AssertionResult
            ((AssertionResult *)&testCaseInfo,&this->m_lastAssertionInfo,
             (AssertionResultData *)local_68);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[2])(pIVar1,&testCaseInfo);
  handleUnfinishedSections(this);
  pTVar2 = TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo
            ((SectionInfo *)&assertions.failedButOk,&pTVar2->lineInfo,&pTVar2->name,
             &pTVar2->description);
  Counts::Counts((Counts *)&testCaseSectionStats.missingAssertions);
  assertions.passed = 1;
  SectionStats::SectionStats
            ((SectionStats *)&testInfo.properties,(SectionInfo *)&assertions.failedButOk,
             (Counts *)&testCaseSectionStats.missingAssertions,0.0,false);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,&testInfo.properties);
  pTVar2 = TestCase::getTestCaseInfo(this->m_activeTestCase);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)&deltaTotals.testCases.failedButOk,pTVar2);
  Totals::Totals((Totals *)local_338);
  deltaTotals.testCases.passed = 1;
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  std::__cxx11::string::string((string *)&local_4d0);
  std::__cxx11::string::string((string *)&local_4f0);
  TestCaseStats::TestCaseStats
            (&local_4b0,(TestCaseInfo *)&deltaTotals.testCases.failedButOk,(Totals *)local_338,
             &local_4d0,&local_4f0,false);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,&local_4b0);
  TestCaseStats::~TestCaseStats(&local_4b0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  (this->m_totals).testCases.failed = (this->m_totals).testCases.failed + 1;
  std::__cxx11::string::string((string *)&local_510);
  testGroupEnded(this,&local_510,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&local_510);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  TestRunStats::TestRunStats(&local_570,&this->m_runInfo,&this->m_totals,false);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar3,&local_570);
  TestRunStats::~TestRunStats(&local_570);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)&deltaTotals.testCases.failedButOk);
  SectionStats::~SectionStats((SectionStats *)&testInfo.properties);
  SectionInfo::~SectionInfo((SectionInfo *)&assertions.failedButOk);
  AssertionResult::~AssertionResult((AssertionResult *)&testCaseInfo);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_68);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            // Don't rebuild the result -- the stringification itself can cause more fatal errors
            // Instead, fake a result data.
            AssertionResultData tempResult;
            tempResult.resultType = ResultWas::FatalErrorCondition;
            tempResult.message = message;
            AssertionResult result(m_lastAssertionInfo, tempResult);

            getResultCapture().assertionEnded(result);

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        std::string(),
                                                        std::string(),
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( std::string(), m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }